

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolrpaintgraphrenderer.cpp
# Opt level: O0

void __thiscall
QColrPaintGraphRenderer::setRadialGradient
          (QColrPaintGraphRenderer *this,QPointF c0,qreal r0,QPointF c1,qreal r1,Spread spread,
          QGradientStops *gradientStops)

{
  QPointF point;
  bool bVar1;
  QDebug *pQVar2;
  QList<std::pair<double,_QColor>_> *in_RDX;
  Spread in_ESI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  qreal in_XMM1_Qa;
  qreal in_XMM2_Qa;
  qreal in_XMM3_Qa;
  qreal in_XMM4_Qa;
  qreal in_XMM5_Qa;
  QPointF QVar3;
  QRadialGradient gradient;
  QPointF c1e;
  QPointF c0e;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QVector2D d1;
  QVector2D d0;
  QLoggingCategory *in_stack_fffffffffffffdf8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffe00;
  QPointF *in_stack_fffffffffffffe08;
  QMessageLogger *in_stack_fffffffffffffe10;
  QGradient *this_00;
  undefined1 in_stack_fffffffffffffe20 [16];
  undefined4 in_stack_fffffffffffffe48;
  QGradient local_190;
  QPointF local_138;
  QPointF local_128;
  QPointF local_118;
  QPointF local_108;
  QPointF local_f8;
  QPointF local_e8;
  QPointF local_d8;
  QPointF local_c8;
  undefined1 local_b8 [56];
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = in_XMM3_Qa;
  local_40 = in_XMM4_Qa;
  local_38 = in_XMM0_Qa;
  local_30 = in_XMM1_Qa;
  if (in_RDI[1].yp != 0.0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcColrv1();
    anon_unknown.dwarf_105964f::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_28);
      if (!bVar1) break;
      anon_unknown.dwarf_105964f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x6ff605);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
                 (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),(char *)in_stack_fffffffffffffdf8,
                 (char *)0x6ff61e);
      QMessageLogger::debug();
      pQVar2 = QDebug::noquote(&local_80);
      in_stack_fffffffffffffe08 = (QPointF *)QDebug::nospace(pQVar2);
      QByteArray::QByteArray((QByteArray *)0x6ff65a);
      QList<QPainterPath>::size((QList<QPainterPath> *)&in_RDI[9].yp);
      QByteArray::fill((char)local_b8,0x20);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffe10,(QByteArray *)in_stack_fffffffffffffe08
                        );
      pQVar2 = QDebug::operator<<((QDebug *)in_RDI,
                                  (char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QDebug::QDebug(&local_78,pQVar2);
      ::operator<<((Stream *)&local_70,(QPointF *)&local_78);
      QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8);
      pQVar2 = QDebug::operator<<((QDebug *)in_RDI,
                                  (char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QDebug::QDebug(&local_68,pQVar2);
      ::operator<<((Stream *)&local_60,(QPointF *)&local_68);
      QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8);
      pQVar2 = QDebug::operator<<((QDebug *)in_RDI,
                                  (char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QDebug::QDebug(&local_58,pQVar2);
      ::operator<<(in_stack_fffffffffffffe20._8_8_,in_stack_fffffffffffffe20._4_4_);
      in_stack_fffffffffffffe10 =
           (QMessageLogger *)
           QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QList<std::pair<double,_QColor>_>::size(in_RDX);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffe00,(qint64)in_stack_fffffffffffffdf8);
      QDebug::operator<<((QDebug *)in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffe48));
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
      QDebug::~QDebug(&local_78);
      QByteArray::~QByteArray((QByteArray *)0x6ff81e);
      QDebug::~QDebug(&local_80);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    local_c8.yp = -NAN;
    local_c8.xp = -NAN;
    QPointF::QPointF(&local_d8,in_XMM2_Qa,0.0);
    local_c8 = ::operator+(in_stack_fffffffffffffe08,(QPointF *)in_stack_fffffffffffffe00);
    local_e8.yp = -NAN;
    local_e8.xp = -NAN;
    QPointF::QPointF(&local_f8,in_XMM5_Qa,0.0);
    local_e8 = ::operator+(in_stack_fffffffffffffe08,(QPointF *)in_stack_fffffffffffffe00);
    local_108 = QTransform::map(in_stack_fffffffffffffe20._8_8_,in_stack_fffffffffffffe20._0_8_);
    local_38 = local_108.xp;
    local_30 = local_108.yp;
    local_118 = QTransform::map(in_stack_fffffffffffffe20._8_8_,in_stack_fffffffffffffe20._0_8_);
    local_c8 = local_118;
    local_128 = QTransform::map(in_stack_fffffffffffffe20._8_8_,in_stack_fffffffffffffe20._0_8_);
    local_48 = local_128.xp;
    local_40 = local_128.yp;
    local_138 = QTransform::map(in_stack_fffffffffffffe20._8_8_,in_stack_fffffffffffffe20._0_8_);
    local_10 = 0xffffffffffffffff;
    local_e8 = local_138;
    ::operator-(in_stack_fffffffffffffe08,(QPointF *)in_stack_fffffffffffffe00);
    QVar3.yp = (qreal)in_RDI;
    QVar3.xp = (qreal)in_stack_fffffffffffffe10;
    QVector2D::QVector2D((QVector2D *)in_stack_fffffffffffffe08,QVar3);
    local_18 = 0xffffffffffffffff;
    QVar3 = ::operator-(in_stack_fffffffffffffe08,(QPointF *)in_stack_fffffffffffffe00);
    this_00 = (QGradient *)QVar3.xp;
    point.yp = (qreal)in_RDI;
    point.xp = (qreal)in_stack_fffffffffffffe10;
    QVector2D::QVector2D((QVector2D *)in_stack_fffffffffffffe08,point);
    memcpy(&local_190,&DAT_00bc8d10,0x58);
    QVector2D::length((QVector2D *)0x6ffac3);
    QVector2D::length((QVector2D *)0x6ffad9);
    QRadialGradient::QRadialGradient
              ((QRadialGradient *)this_00,in_RDI,(qreal)in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08,(qreal)in_stack_fffffffffffffe00);
    QGradient::setCoordinateMode(&local_190,LogicalMode);
    QGradient::setSpread(&local_190,in_ESI);
    QGradient::setStops(this_00,(QGradientStops *)in_RDI);
    QBrush::QBrush((QBrush *)in_stack_fffffffffffffe08,(QGradient *)in_RDI[1].yp);
    QPainter::setBrush((QPainter *)in_RDI,(QBrush *)in_stack_fffffffffffffe10);
    QBrush::~QBrush((QBrush *)0x6ffb5e);
    QRadialGradient::~QRadialGradient((QRadialGradient *)0x6ffb68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColrPaintGraphRenderer::setRadialGradient(QPointF c0, qreal r0,
                                                QPointF c1, qreal r1,
                                                QGradient::Spread spread,
                                                const QGradientStops &gradientStops)
{
    if (m_painter != nullptr) {
        qCDebug(lcColrv1).noquote().nospace()
            << QByteArray().fill(' ', m_oldPaths.size() * 2)
            << "[radial gradient " << c0
            << ", rad=" << r0
            << ", " << c1
            << ", rad=" << r1
            << ", spread: " << spread
            << ", stop count: " << gradientStops.size()
            << "]";

        QPointF c0e(c0 + QPointF(r0, 0.0));
        QPointF c1e(c1 + QPointF(r1, 0.0));

        c0 = m_currentTransform.map(c0);
        c0e = m_currentTransform.map(c0e);
        c1 = m_currentTransform.map(c1);
        c1e = m_currentTransform.map(c1e);

        const QVector2D d0(c0e - c0);
        const QVector2D d1(c1e - c1);

        QRadialGradient gradient(c1, d1.length(), c0, d0.length());
        gradient.setCoordinateMode(QGradient::LogicalMode);
        gradient.setSpread(spread);
        gradient.setStops(gradientStops);
        m_painter->setBrush(gradient);
    }
}